

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_io.cc
# Opt level: O1

void __thiscall gimage::PNMImageIO::save(PNMImageIO *this,ImageU8 *image,char *name)

{
  int iVar1;
  IOException *this_00;
  long *plVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  string type;
  ofstream out;
  undefined1 auStack_278 [7];
  allocator local_271;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  undefined1 local_230 [8];
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  int aiStack_210 [4];
  uchar *local_200;
  uchar *local_1f8;
  ios_base local_138 [264];
  
  iVar1 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name,0);
  if (((char)iVar1 == '\0') || ((image->depth | 2U) != 3)) {
    this_00 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_250,name,&local_271);
    std::operator+(&local_270,"Can only save PNM images with depth 1 or 3 (",&local_250);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_270);
    local_230 = (undefined1  [8])*plVar2;
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar2 + 2);
    if (local_230 == (undefined1  [8])paVar3) {
      local_220._M_allocated_capacity = paVar3->_M_allocated_capacity;
      local_220._8_8_ = plVar2[3];
      local_230 = (undefined1  [8])&local_220;
    }
    else {
      local_220._M_allocated_capacity = paVar3->_M_allocated_capacity;
    }
    local_228 = plVar2[1];
    *plVar2 = (long)paVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    gutil::IOException::IOException(this_00,(string *)local_230);
    __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"P5","");
  if (image->depth == 3) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_270,0,(char *)local_270._M_string_length,0x150b22);
  }
  anon_unknown_11::writePNMHeader
            (name,local_270._M_dataplus._M_p,image->width,image->height,0xff,0.0);
  std::ofstream::ofstream(local_230);
  lVar6 = *(long *)((long)local_230 + -0x18);
  *(undefined4 *)((long)aiStack_210 + lVar6 + -4) = 5;
  std::ios::clear((int)auStack_278 + (int)lVar6 + 0x48);
  std::ofstream::open(local_230,(_Ios_Openmode)name);
  if (0 < image->height) {
    lVar6 = 0;
    do {
      if (*(int *)((long)aiStack_210 + *(long *)((long)local_230 + -0x18)) != 0) break;
      if (0 < image->width) {
        lVar5 = 0;
        do {
          if (0 < image->depth) {
            lVar4 = 0;
            do {
              if (local_200 < local_1f8) {
                *local_200 = image->img[lVar4][lVar6][lVar5];
                local_200 = local_200 + 1;
              }
              else {
                (**(code **)(local_228 + 0x68))
                          ((filebuf *)&local_228,image->img[lVar4][lVar6][lVar5]);
              }
              lVar4 = lVar4 + 1;
            } while (lVar4 < image->depth);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < image->width);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < image->height);
  }
  std::ofstream::close();
  local_230 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf((filebuf *)&local_228);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  return;
}

Assistant:

void PNMImageIO::save(const ImageU8 &image, const char *name) const
{
  if (!handlesFile(name, false) || (image.getDepth() != 1 && image.getDepth() != 3))
  {
    throw gutil::IOException("Can only save PNM images with depth 1 or 3 ("+std::string(name)+")");
  }

  std::string type="P5";

  if (image.getDepth() == 3)
  {
    type="P6";
  }

  writePNMHeader(name, type.c_str(), image.getWidth(), image.getHeight(),
                 255, 0);

  try
  {
    std::ofstream out;
    out.exceptions(std::ios_base::failbit | std::ios_base::badbit);
    out.open(name, std::ios::binary|std::ios::app);

    std::streambuf *sb=out.rdbuf();

    for (long k=0; k<image.getHeight() && out.good(); k++)
    {
      for (long i=0; i<image.getWidth(); i++)
      {
        for (int j=0; j<image.getDepth(); j++)
        {
          sb->sputc(static_cast<char>(image.get(i, k, j)));
        }
      }
    }

    out.close();
  }
  catch (const std::ios_base::failure &ex)
  {
    throw gutil::IOException(ex.what());
  }
}